

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_sock_init(void *arg,nni_sock *sock)

{
  req0_sock *s;
  nni_sock *sock_local;
  void *arg_local;
  
  nni_id_map_init((nni_id_map *)((long)arg + 0x2f8),0x80000000,0xffffffff,true);
  nni_mtx_init((nni_mtx *)((long)arg + 0x358));
  nni_list_init_offset((nni_list *)((long)arg + 0xa0),0x10);
  nni_list_init_offset((nni_list *)((long)arg + 0xb8),0x10);
  nni_list_init_offset((nni_list *)((long)arg + 0xd0),0x10);
  nni_list_init_offset((nni_list *)((long)arg + 0x100),0x18);
  nni_list_init_offset((nni_list *)((long)arg + 0x118),0x38);
  nni_list_init_offset((nni_list *)((long)arg + 0xe8),8);
  *(undefined4 *)arg = 60000;
  *(undefined4 *)((long)arg + 0x350) = 1000;
  req0_ctx_init((void *)((long)arg + 0x10),arg);
  nni_pollable_init((nni_pollable *)((long)arg + 0x340));
  nni_pollable_init((nni_pollable *)((long)arg + 0x330));
  nni_aio_init((nni_aio *)((long)arg + 0x130),req0_retry_cb,arg);
  nni_atomic_init((nni_atomic_int *)((long)arg + 8));
  nni_atomic_set((nni_atomic_int *)((long)arg + 8),8);
  return;
}

Assistant:

static void
req0_sock_init(void *arg, nni_sock *sock)
{
	req0_sock *s = arg;

	NNI_ARG_UNUSED(sock);

	// Request IDs are 32 bits, with the high order bit set.
	// We start at a random point, to minimize likelihood of
	// accidental collision across restarts.
	nni_id_map_init(&s->requests, 0x80000000u, 0xffffffffu, true);

	nni_mtx_init(&s->mtx);

	NNI_LIST_INIT(&s->ready_pipes, req0_pipe, node);
	NNI_LIST_INIT(&s->busy_pipes, req0_pipe, node);
	NNI_LIST_INIT(&s->stop_pipes, req0_pipe, node);
	NNI_LIST_INIT(&s->send_queue, req0_ctx, send_node);
	NNI_LIST_INIT(&s->retry_queue, req0_ctx, retry_node);
	NNI_LIST_INIT(&s->contexts, req0_ctx, sock_node);

	// this is "semi random" start for request IDs.
	s->retry      = NNI_SECOND * 60;
	s->retry_tick = NNI_SECOND; // how often we check for retries

	req0_ctx_init(&s->master, s);

	nni_pollable_init(&s->writable);
	nni_pollable_init(&s->readable);

	nni_aio_init(&s->retry_aio, req0_retry_cb, s);

	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8);
}